

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

int FFont::SimpleTranslation(BYTE *colorsused,BYTE *translation,BYTE *reverse,double **luminosity)

{
  PalEntry PVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  memset(translation,0,0x100);
  *reverse = '\0';
  iVar5 = 1;
  lVar3 = 1;
  while( true ) {
    lVar6 = (long)iVar5;
    if (lVar3 == 0x100) break;
    if (colorsused[lVar3] != '\0') {
      iVar5 = iVar5 + 1;
      reverse[lVar6] = (BYTE)lVar3;
    }
    lVar3 = lVar3 + 1;
  }
  lVar3 = 1;
  qsort(reverse + 1,(long)(iVar5 + -1),1,compare);
  uVar7 = 0xffffffffffffffff;
  if (-1 < iVar5) {
    uVar7 = lVar6 * 8;
  }
  pdVar4 = (double *)operator_new__(uVar7);
  *luminosity = pdVar4;
  *pdVar4 = 0.0;
  dVar8 = 100000000.0;
  dVar9 = 0.0;
  for (; lVar3 < lVar6; lVar3 = lVar3 + 1) {
    translation[reverse[lVar3]] = (BYTE)lVar3;
    PVar1.field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[reverse[lVar3]].field_0.d;
    dVar10 = (double)((uint)PVar1.field_0 & 0xff) * 0.114 +
             (double)((uint)PVar1.field_0 >> 8 & 0xff) * 0.587 +
             (double)((uint)PVar1.field_0 >> 0x10 & 0xff) * 0.299;
    pdVar4 = *luminosity;
    pdVar4[lVar3] = dVar10;
    dVar2 = dVar10;
    if (dVar10 <= dVar9) {
      dVar2 = dVar9;
    }
    dVar9 = dVar2;
    if (dVar8 <= dVar10) {
      dVar10 = dVar8;
    }
    dVar8 = dVar10;
  }
  for (lVar3 = 1; lVar3 < lVar6; lVar3 = lVar3 + 1) {
    pdVar4[lVar3] = (pdVar4[lVar3] - dVar8) * (1.0 / (dVar9 - dVar8));
  }
  return iVar5;
}

Assistant:

int FFont::SimpleTranslation (BYTE *colorsused, BYTE *translation, BYTE *reverse, double **luminosity)
{
	double min, max, diver;
	int i, j;

	memset (translation, 0, 256);

	reverse[0] = 0;
	for (i = 1, j = 1; i < 256; i++)
	{
		if (colorsused[i])
		{
			reverse[j++] = i;
		}
	}

	qsort (reverse+1, j-1, 1, compare);

	*luminosity = new double[j];
	(*luminosity)[0] = 0.0; // [BL] Prevent uninitalized memory
	max = 0.0;
	min = 100000000.0;
	for (i = 1; i < j; i++)
	{
		translation[reverse[i]] = i;

		(*luminosity)[i] = RPART(GPalette.BaseColors[reverse[i]]) * 0.299 +
						   GPART(GPalette.BaseColors[reverse[i]]) * 0.587 +
						   BPART(GPalette.BaseColors[reverse[i]]) * 0.114;
		if ((*luminosity)[i] > max)
			max = (*luminosity)[i];
		if ((*luminosity)[i] < min)
			min = (*luminosity)[i];
	}
	diver = 1.0 / (max - min);
	for (i = 1; i < j; i++)
	{
		(*luminosity)[i] = ((*luminosity)[i] - min) * diver;
	}

	return j;
}